

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_420.cpp
# Opt level: O2

int __thiscall YUV420::ReadFromYUVFile(YUV420 *this,string *filename)

{
  size_t sVar1;
  double dVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  size_t j_1;
  uint8_t *puVar10;
  size_t j;
  undefined1 auVar11 [16];
  uint8_t temp;
  ulong local_290;
  long local_288;
  size_t local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  ifstream infile;
  
  sVar1 = this->width_;
  puVar10 = this->y_;
  puVar8 = this->u_;
  puVar9 = this->v_;
  std::ifstream::ifstream(&infile,(string *)filename,_S_in|_S_bin|_S_ate);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    iVar7 = -1;
  }
  else {
    local_258._8_8_ = 0;
    local_260 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp:27:3)>
                ::_M_invoke;
    local_278._8_8_ = 0;
    local_268 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp:27:3)>
                ::_M_manager;
    local_248 = 0;
    uStack_240 = 0;
    local_278._M_unused._M_object = &infile;
    local_258._M_unused._M_object = &infile;
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_258);
    lVar4 = std::istream::tellg();
    std::istream::seekg((long)&infile,_S_beg);
    lVar5 = std::istream::tellg();
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this->size_;
    auVar11 = vpunpckldq_avx(auVar11,_DAT_0013f180);
    auVar11 = vsubpd_avx(auVar11,_DAT_0013f190);
    dVar2 = (auVar11._0_8_ + auVar11._8_8_) * 1.5;
    uVar6 = (ulong)dVar2;
    if (lVar4 - lVar5 != ((long)(dVar2 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6)) {
      __assert_fail("fsize == static_cast<size_t>(1.5 * size_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/yuv_420.cpp"
                    ,0x20,"int YUV420::ReadFromYUVFile(const string &)");
    }
    std::istream::read((char *)&infile,(long)puVar10);
    puVar10 = puVar8 + sVar1 + 1;
    local_288 = sVar1 * 2;
    puVar8 = puVar8 + 1;
    local_290 = 0;
    local_280 = sVar1;
    while( true ) {
      uVar6 = this->height_;
      if (uVar6 <= local_290) break;
      for (uVar6 = 0; uVar6 < this->width_; uVar6 = uVar6 + 2) {
        std::istream::read((char *)&infile,(long)&temp);
        puVar10[uVar6] = temp;
        puVar8[uVar6] = temp;
        puVar10[uVar6 - 1] = temp;
        puVar8[uVar6 - 1] = temp;
      }
      local_290 = local_290 + 2;
      puVar10 = puVar10 + local_288;
      puVar8 = puVar8 + local_288;
    }
    puVar10 = puVar9 + local_280 + 1;
    puVar9 = puVar9 + 1;
    for (local_290 = 0; local_290 < uVar6; local_290 = local_290 + 2) {
      for (uVar6 = 0; uVar6 < this->width_; uVar6 = uVar6 + 2) {
        std::istream::read((char *)&infile,(long)&temp);
        puVar10[uVar6] = temp;
        puVar9[uVar6] = temp;
        puVar10[uVar6 - 1] = temp;
        puVar9[uVar6 - 1] = temp;
      }
      uVar6 = this->height_;
      puVar10 = puVar10 + local_288;
      puVar9 = puVar9 + local_288;
    }
    DeferredAction::~DeferredAction((DeferredAction *)&local_278);
    iVar7 = 0;
  }
  std::ifstream::~ifstream(&infile);
  return iVar7;
}

Assistant:

int YUV420::ReadFromYUVFile(const string &filename) {
  auto y = reinterpret_cast<uint8_t (*)[width_]>(y_);
  auto u = reinterpret_cast<uint8_t (*)[width_]>(u_);
  auto v = reinterpret_cast<uint8_t (*)[width_]>(v_);

  std::ifstream infile(filename, std::ifstream::in | std::ifstream::binary | std::ifstream::ate);
  if (!infile.is_open()){ return -1;}
  DEFER({infile.close();});

  std::streampos fsize = infile.tellg();
  infile.seekg(0, std::ifstream::beg);
  fsize = fsize - infile.tellg();
  assert(fsize == static_cast<size_t>(1.5 * size_));

  infile.read(reinterpret_cast<char *>(y), size_);
  for(size_t i = 0; i < height_; i+=2){
    for(size_t j = 0; j < width_; j+=2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      u[i][j] = u[i + 1][j] = u[i][j + 1] = u[i + 1][j + 1] = temp;
    }
  }

  for(size_t i = 0; i < height_; i += 2){
    for(size_t j = 0; j < width_; j += 2){
      uint8_t temp;
      infile.read(reinterpret_cast<char *>(&temp), 1);
      v[i][j] = v[i + 1][j] = v[i][j + 1] = v[i + 1][j + 1] = temp;
    }
  }
  return 0;
}